

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O0

Flags __thiscall absl::lts_20250127::str_format_internal::ConvTag::as_flags(ConvTag *this)

{
  bool bVar1;
  ConvTag *this_local;
  
  bVar1 = is_conv(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_conv()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x6f,"Flags absl::str_format_internal::ConvTag::as_flags() const");
  }
  bVar1 = is_length(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x70,"Flags absl::str_format_internal::ConvTag::as_flags() const");
  }
  bVar1 = is_flags(this);
  if (!bVar1) {
    __assert_fail("is_flags()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x71,"Flags absl::str_format_internal::ConvTag::as_flags() const");
  }
  return this->tag_ & (kZero|kAlt|kSignCol|kShowPos|kLeft);
}

Assistant:

constexpr Flags as_flags() const {
    assert(!is_conv());
    assert(!is_length());
    assert(is_flags());
    return static_cast<Flags>(tag_ & 0x1F);
  }